

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  bool bVar1;
  ImGuiTabItemFlags IVar2;
  ImGuiID IVar3;
  ImGuiTabItemFlags IVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  ImGuiContext *pIVar10;
  int iVar11;
  ImGuiTabItem *pIVar12;
  ImGuiTabItem *pIVar13;
  ImVector<ImGuiTabBarSortItem> *this;
  char *label;
  ImGuiTabBarSortItem *pIVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  ImVec2 IVar18;
  float local_15c;
  float local_134;
  float local_128;
  float local_11c;
  bool teleport;
  ImGuiTabItem *scroll_track_selected_tab;
  ImGuiTabItem *tab_to_select_1;
  bool scrolling_buttons;
  ImGuiTabItem *tab_3;
  int tab_n_4;
  float offset_x;
  ImGuiTabItem *tab_2;
  int tab_n_3;
  float tab_max_width;
  int tab_n_2;
  int tab_n_1;
  float width_to_remove_per_tab;
  float width_to_remove_per_tab_max;
  int tab_count_same_width;
  float width_excess;
  float width_avail;
  char *tab_name;
  ImGuiTabItem *tab_1;
  int tab_n;
  bool found_selected_tab_id;
  ImGuiTabItem *most_recently_selected_tab;
  float width_total_contents;
  ImVector<ImGuiTabBarSortItem> *width_sort_buffer;
  ImGuiTabItem *tab_to_select;
  bool tab_list_popup_button;
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  ImGuiID scroll_track_selected_tab_id;
  ImGuiTabItem *tab;
  int tab_src_n;
  int tab_dst_n;
  ImGuiContext *g;
  ImGuiTabBar *tab_bar_local;
  
  pIVar10 = GImGui;
  tab_bar->WantLayout = false;
  tab._4_4_ = 0;
  for (tab._0_4_ = 0; (int)tab < (tab_bar->Tabs).Size; tab._0_4_ = (int)tab + 1) {
    pIVar12 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab);
    if (pIVar12->LastFrameVisible < tab_bar->PrevFrameVisible) {
      if (pIVar12->ID == tab_bar->SelectedTabId) {
        tab_bar->SelectedTabId = 0;
      }
    }
    else {
      if (tab._4_4_ != (int)tab) {
        pIVar12 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab);
        pIVar13 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
        IVar2 = pIVar12->Flags;
        pIVar13->ID = pIVar12->ID;
        pIVar13->Flags = IVar2;
        iVar11 = pIVar12->LastFrameSelected;
        pIVar13->LastFrameVisible = pIVar12->LastFrameVisible;
        pIVar13->LastFrameSelected = iVar11;
        fVar16 = pIVar12->Offset;
        pIVar13->NameOffset = pIVar12->NameOffset;
        pIVar13->Offset = fVar16;
        fVar16 = pIVar12->WidthContents;
        pIVar13->Width = pIVar12->Width;
        pIVar13->WidthContents = fVar16;
      }
      tab._4_4_ = tab._4_4_ + 1;
    }
  }
  if ((tab_bar->Tabs).Size != tab._4_4_) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,tab._4_4_);
  }
  tab1._4_4_ = 0;
  if (tab_bar->NextSelectedTabId != 0) {
    tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
    tab_bar->NextSelectedTabId = 0;
    tab1._4_4_ = tab_bar->SelectedTabId;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar12 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar12 != (ImGuiTabItem *)0x0) {
      iVar11 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar12);
      iVar11 = iVar11 + tab_bar->ReorderRequestDir;
      if ((-1 < iVar11) && (iVar11 < (tab_bar->Tabs).Size)) {
        pIVar13 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar11);
        IVar3 = pIVar12->ID;
        IVar4 = pIVar12->Flags;
        iVar5 = pIVar12->LastFrameVisible;
        iVar6 = pIVar12->LastFrameSelected;
        iVar7 = pIVar12->NameOffset;
        fVar17 = pIVar12->Offset;
        fVar8 = pIVar12->Width;
        fVar9 = pIVar12->WidthContents;
        IVar2 = pIVar13->Flags;
        pIVar12->ID = pIVar13->ID;
        pIVar12->Flags = IVar2;
        iVar11 = pIVar13->LastFrameSelected;
        pIVar12->LastFrameVisible = pIVar13->LastFrameVisible;
        pIVar12->LastFrameSelected = iVar11;
        fVar16 = pIVar13->Offset;
        pIVar12->NameOffset = pIVar13->NameOffset;
        pIVar12->Offset = fVar16;
        fVar16 = pIVar13->WidthContents;
        pIVar12->Width = pIVar13->Width;
        pIVar12->WidthContents = fVar16;
        pIVar13->ID = IVar3;
        pIVar13->Flags = IVar4;
        pIVar13->LastFrameVisible = iVar5;
        pIVar13->LastFrameSelected = iVar6;
        pIVar13->NameOffset = iVar7;
        pIVar13->Offset = fVar17;
        pIVar13->Width = fVar8;
        pIVar13->WidthContents = fVar9;
        if (pIVar13->ID == tab_bar->SelectedTabId) {
          tab1._4_4_ = pIVar13->ID;
        }
      }
      if ((tab_bar->Flags & 0x400000U) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  if (((tab_bar->Flags & 4U) != 0) &&
     (pIVar12 = TabBarTabListPopupButton(tab_bar), pIVar12 != (ImGuiTabItem *)0x0)) {
    tab1._4_4_ = pIVar12->ID;
    tab_bar->SelectedTabId = tab1._4_4_;
  }
  this = &pIVar10->TabSortByWidthBuffer;
  ImVector<ImGuiTabBarSortItem>::resize(this,(tab_bar->Tabs).Size);
  most_recently_selected_tab._4_4_ = 0.0;
  _tab_n = (ImGuiTabItem *)0x0;
  bVar1 = false;
  tab_1._0_4_ = 0;
  while( true ) {
    if ((tab_bar->Tabs).Size <= (int)tab_1) {
      local_128 = ImRect::GetWidth(&tab_bar->BarRect);
      if (most_recently_selected_tab._4_4_ <= local_128) {
        local_128 = 0.0;
      }
      else {
        local_128 = most_recently_selected_tab._4_4_ - local_128;
      }
      width_to_remove_per_tab_max = local_128;
      if ((local_128 <= 0.0) || ((tab_bar->Flags & 0x40U) == 0)) {
        fVar16 = TabBarCalcMaxTabWidth();
        for (tab_2._4_4_ = 0; tab_2._4_4_ < (tab_bar->Tabs).Size; tab_2._4_4_ = tab_2._4_4_ + 1) {
          pIVar12 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab_2._4_4_);
          fVar17 = ImMin<float>(pIVar12->WidthContents,fVar16);
          pIVar12->Width = fVar17;
        }
      }
      else {
        if (1 < (tab_bar->Tabs).Size) {
          qsort((pIVar10->TabSortByWidthBuffer).Data,(long)this->Size,8,TabBarSortItemComparer);
        }
        width_to_remove_per_tab = 1.4013e-45;
        while( true ) {
          bVar15 = false;
          if (0.0 < width_to_remove_per_tab_max) {
            bVar15 = (int)width_to_remove_per_tab < (tab_bar->Tabs).Size;
          }
          if (!bVar15) break;
          while( true ) {
            bVar15 = false;
            if ((int)width_to_remove_per_tab < (tab_bar->Tabs).Size) {
              pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
              fVar16 = pIVar14->Width;
              pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,(int)width_to_remove_per_tab)
              ;
              bVar15 = fVar16 == pIVar14->Width;
            }
            if (!bVar15) break;
            width_to_remove_per_tab = (float)((int)width_to_remove_per_tab + 1);
          }
          if ((int)width_to_remove_per_tab < (tab_bar->Tabs).Size) {
            pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
            local_134 = pIVar14->Width;
            pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,(int)width_to_remove_per_tab);
            local_134 = local_134 - pIVar14->Width;
          }
          else {
            pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
            local_134 = pIVar14->Width - 1.0;
          }
          fVar16 = ImMin<float>(width_to_remove_per_tab_max / (float)(int)width_to_remove_per_tab,
                                local_134);
          for (tab_max_width = 0.0; (int)tab_max_width < (int)width_to_remove_per_tab;
              tab_max_width = (float)((int)tab_max_width + 1)) {
            pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,(int)tab_max_width);
            pIVar14->Width = pIVar14->Width - fVar16;
          }
          width_to_remove_per_tab_max =
               -fVar16 * (float)(int)width_to_remove_per_tab + width_to_remove_per_tab_max;
        }
        for (tab_n_3 = 0; tab_n_3 < (tab_bar->Tabs).Size; tab_n_3 = tab_n_3 + 1) {
          pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,tab_n_3);
          fVar16 = pIVar14->Width;
          pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,tab_n_3);
          pIVar12 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar14->Index);
          pIVar12->Width = (float)(int)fVar16;
        }
      }
      tab_3._4_4_ = 0.0;
      for (tab_3._0_4_ = 0; (int)tab_3 < (tab_bar->Tabs).Size; tab_3._0_4_ = (int)tab_3 + 1) {
        pIVar12 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab_3);
        pIVar12->Offset = tab_3._4_4_;
        if ((tab1._4_4_ == 0) && (pIVar10->NavJustMovedToId == pIVar12->ID)) {
          tab1._4_4_ = pIVar12->ID;
        }
        tab_3._4_4_ = pIVar12->Width + (pIVar10->Style).ItemInnerSpacing.x + tab_3._4_4_;
      }
      fVar16 = ImMax<float>(tab_3._4_4_ - (pIVar10->Style).ItemInnerSpacing.x,0.0);
      tab_bar->OffsetMax = fVar16;
      tab_bar->OffsetNextTab = 0.0;
      fVar16 = tab_bar->OffsetMax;
      fVar17 = ImRect::GetWidth(&tab_bar->BarRect);
      bVar15 = false;
      if (((fVar17 < fVar16) && (bVar15 = false, 1 < (tab_bar->Tabs).Size)) &&
         (bVar15 = false, (tab_bar->Flags & 0x10U) == 0)) {
        bVar15 = (tab_bar->Flags & 0x80U) != 0;
      }
      if ((bVar15) && (pIVar12 = TabBarScrollingButtons(tab_bar), pIVar12 != (ImGuiTabItem *)0x0)) {
        tab1._4_4_ = pIVar12->ID;
        tab_bar->SelectedTabId = tab1._4_4_;
      }
      if (!bVar1) {
        tab_bar->SelectedTabId = 0;
      }
      if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
         (_tab_n != (ImGuiTabItem *)0x0)) {
        tab1._4_4_ = _tab_n->ID;
        tab_bar->SelectedTabId = tab1._4_4_;
      }
      tab_bar->VisibleTabId = tab_bar->SelectedTabId;
      tab_bar->VisibleTabWasSubmitted = false;
      if ((tab1._4_4_ != 0) &&
         (pIVar12 = TabBarFindTabByID(tab_bar,tab1._4_4_), pIVar12 != (ImGuiTabItem *)0x0)) {
        TabBarScrollToTab(tab_bar,pIVar12);
      }
      fVar16 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
      tab_bar->ScrollingAnim = fVar16;
      fVar16 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
      tab_bar->ScrollingTarget = fVar16;
      if ((tab_bar->ScrollingAnim != tab_bar->ScrollingTarget) ||
         (NAN(tab_bar->ScrollingAnim) || NAN(tab_bar->ScrollingTarget))) {
        fVar16 = ImMax<float>(tab_bar->ScrollingSpeed,pIVar10->FontSize * 70.0);
        tab_bar->ScrollingSpeed = fVar16;
        fVar16 = tab_bar->ScrollingSpeed;
        fVar17 = ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim);
        fVar16 = ImMax<float>(fVar16,fVar17 / 0.3);
        tab_bar->ScrollingSpeed = fVar16;
        bVar1 = true;
        if (pIVar10->FrameCount <= tab_bar->PrevFrameVisible + 1) {
          bVar1 = pIVar10->FontSize * 10.0 < tab_bar->ScrollingTargetDistToVisibility;
        }
        if (bVar1) {
          local_15c = tab_bar->ScrollingTarget;
        }
        else {
          local_15c = ImLinearSweep(tab_bar->ScrollingAnim,tab_bar->ScrollingTarget,
                                    (pIVar10->IO).DeltaTime * tab_bar->ScrollingSpeed);
        }
        tab_bar->ScrollingAnim = local_15c;
      }
      else {
        tab_bar->ScrollingSpeed = 0.0;
      }
      if ((tab_bar->Flags & 0x100000U) == 0) {
        ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
      }
      return;
    }
    pIVar12 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,(int)tab_1);
    if (pIVar12->LastFrameVisible < tab_bar->PrevFrameVisible) break;
    if ((_tab_n == (ImGuiTabItem *)0x0) || (_tab_n->LastFrameSelected < pIVar12->LastFrameSelected))
    {
      _tab_n = pIVar12;
    }
    if (pIVar12->ID == tab_bar->SelectedTabId) {
      bVar1 = true;
    }
    label = ImGuiTabBar::GetTabName(tab_bar,pIVar12);
    IVar18 = TabItemCalcSize(label,(pIVar12->Flags & 0x100000U) == 0);
    width_excess = IVar18.x;
    pIVar12->WidthContents = width_excess;
    if ((int)tab_1 < 1) {
      local_11c = 0.0;
    }
    else {
      local_11c = (pIVar10->Style).ItemInnerSpacing.x;
    }
    most_recently_selected_tab._4_4_ =
         local_11c + pIVar12->WidthContents + most_recently_selected_tab._4_4_;
    pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,(int)tab_1);
    pIVar14->Index = (int)tab_1;
    fVar16 = pIVar12->WidthContents;
    pIVar14 = ImVector<ImGuiTabBarSortItem>::operator[](this,(int)tab_1);
    pIVar14->Width = fVar16;
    tab_1._0_4_ = (int)tab_1 + 1;
  }
  __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                ,0x18df,"void ImGui::TabBarLayout(ImGuiTabBar *)");
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        tab->WidthContents = TabItemCalcSize(tab_name, (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}